

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O2

void __thiscall
Fl_PostScript_Graphics_Driver::close_rle85(Fl_PostScript_Graphics_Driver *this,void *data)

{
  int len;
  void *data_00;
  uchar c;
  
  if (*(int *)((long)data + 0x8c) < 1) {
    if (*(int *)((long)data + 0x88) == 0) goto LAB_0020066b;
    c = (char)*(int *)((long)data + 0x88) + 0xff;
    write85(this,*data,&c,1);
    data_00 = *data;
    len = *(int *)((long)data + 0x88);
  }
  else {
    c = '\x01' - (char)*(int *)((long)data + 0x8c);
    len = 1;
    write85(this,*data,&c,1);
    data_00 = *data;
  }
  write85(this,data_00,(uchar *)((long)data + 8),len);
LAB_0020066b:
  c = 0x80;
  write85(this,*data,&c,1);
  close85(this,*data);
  operator_delete(data,0x90);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::close_rle85(void *data) // stop doing RLE+ASCII85 encoding
{
  struct_rle85 *rle = (struct_rle85 *)data;
  uchar c;
  if (rle->run_length > 0) { // if within a run, output it
    c = (uchar)(257 - rle->run_length);
    write85(rle->data85, &c, 1);
    write85(rle->data85, rle->buffer, 1);
  } else if (rle->count) { // output the non-run buffer, if not empty
    c = (uchar)(rle->count - 1);
    write85(rle->data85, &c, 1);
    write85(rle->data85, rle->buffer, rle->count);
  }
  c = (uchar)128;
  write85(rle->data85, &c, 1); // output EOD mark
  close85(rle->data85); // close ASCII85 encoding process
  delete rle;
}